

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O1

void VRSHFT(int NN,int L3,double *ZR,double *ZI,int *CONV,double *SR,double *SI,double *PR,
           double *PI,double *QPR,double *QPI,double *PVR,double *PVI,double ARE,double MRE,
           double ETA,double INFIN,double *HR,double *HI,double *QHR,double *QHI,double *SHR,
           double *SHI,double *TR,double *TI)

{
  double dVar1;
  bool bVar2;
  int NN_00;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_b0;
  double local_88;
  int local_74;
  double dStack_70;
  int BOOL;
  int local_64;
  ulong local_60;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  double local_38;
  
  *(undefined8 *)CONV = *(undefined8 *)CONCAT44(in_register_00000034,L3);
  *SR = *ZR;
  *(undefined4 *)ZI = 0;
  local_60 = (ulong)(uint)NN;
  iVar3 = 0;
  bVar2 = false;
  local_64 = NN;
  local_40 = INFIN;
  local_38 = ARE;
  do {
    POLYEV(local_64,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
    dVar1 = ABS(*QPI);
    dVar8 = ABS(*PVR);
    if (dVar8 <= dVar1) {
      if (dVar8 < dVar1) {
        dVar8 = (dVar8 / dVar1) * (dVar8 / dVar1) + 1.0;
        if (dVar8 < 0.0) {
          uStack_50 = 0;
          local_58 = dVar1;
          dVar8 = sqrt(dVar8);
          dVar1 = local_58;
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dStack_70 = dVar8 * dVar1;
      }
      else {
        dStack_70 = dVar1 * 1.4142135623730951;
      }
    }
    else {
      dVar1 = (dVar1 / dVar8) * (dVar1 / dVar8) + 1.0;
      if (dVar1 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar8;
        dVar1 = sqrt(dVar1);
        dVar8 = local_58;
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      dStack_70 = dVar1 * dVar8;
    }
    dVar1 = ABS(*(double *)CONV);
    dVar8 = ABS(*SR);
    if (dVar8 <= dVar1) {
      if (dVar1 <= dVar8) {
        dVar7 = dVar1 * 1.4142135623730951;
      }
      else {
        dVar7 = (dVar8 / dVar1) * (dVar8 / dVar1) + 1.0;
        if (dVar7 < 0.0) {
          uStack_50 = 0;
          local_58 = dVar1;
          dVar7 = sqrt(dVar7);
          dVar1 = local_58;
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar7 = dVar7 * dVar1;
      }
    }
    else {
      dVar7 = (dVar1 / dVar8) * (dVar1 / dVar8) + 1.0;
      if (dVar7 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar8;
        dVar7 = sqrt(dVar7);
        dVar8 = local_58;
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = dVar7 * dVar8;
    }
    dVar1 = ABS(*PI);
    dVar8 = ABS(*QPR);
    if (dVar8 <= dVar1) {
      if (dVar1 <= dVar8) {
        dVar9 = dVar1 * 1.4142135623730951;
      }
      else {
        dVar9 = (dVar8 / dVar1) * (dVar8 / dVar1) + 1.0;
        if (dVar9 < 0.0) {
          uStack_50 = 0;
          local_58 = dVar1;
          dVar9 = sqrt(dVar9);
          dVar1 = local_58;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar9 = dVar9 * dVar1;
      }
    }
    else {
      dVar9 = (dVar1 / dVar8) * (dVar1 / dVar8) + 1.0;
      if (dVar9 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar8;
        dVar9 = sqrt(dVar9);
        dVar8 = local_58;
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = dVar9 * dVar8;
    }
    dVar1 = (dVar9 * MRE) / (ARE + MRE);
    dVar8 = local_40;
    dVar9 = local_38;
    if (0 < local_64) {
      uVar6 = 0;
      uVar4 = local_60;
      do {
        dVar10 = ABS(PI[uVar6]);
        dVar12 = ABS(QPR[uVar6]);
        if (dVar12 <= dVar10) {
          if (dVar10 <= dVar12) {
            dVar11 = dVar10 * 1.4142135623730951;
          }
          else {
            dVar11 = (dVar12 / dVar10) * (dVar12 / dVar10) + 1.0;
            if (dVar11 < 0.0) {
              local_58 = dVar1;
              dVar11 = sqrt(dVar11);
              uVar4 = local_60;
              dVar8 = local_40;
              dVar9 = local_38;
              dVar1 = local_58;
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            dVar11 = dVar11 * dVar10;
          }
        }
        else {
          dVar11 = (dVar10 / dVar12) * (dVar10 / dVar12) + 1.0;
          if (dVar11 < 0.0) {
            local_58 = dVar1;
            dVar11 = sqrt(dVar11);
            uVar4 = local_60;
            dVar8 = local_40;
            dVar9 = local_38;
            dVar1 = local_58;
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar11 = dVar11 * dVar12;
        }
        dVar1 = dVar1 * dVar7 + dVar11;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    if (dStack_70 <= (dVar1 * (ARE + MRE) - dStack_70 * MRE) * 20.0) {
      *(undefined4 *)ZI = 1;
      *(undefined8 *)CONCAT44(in_register_00000034,L3) = *(undefined8 *)CONV;
      *ZR = *SR;
      return;
    }
    if (iVar3 != 0) {
      if (((bVar2) || (dStack_70 < local_b0)) || (0.05 <= local_88)) {
        if (local_b0 < dStack_70 * 0.1) {
          return;
        }
      }
      else {
        dVar1 = ETA;
        if (ETA <= local_88) {
          dVar1 = local_88;
        }
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        dVar8 = *(double *)CONV;
        dVar7 = *SR;
        *SR = dVar8 * dVar1 + (dVar1 + 1.0) * dVar7;
        *(double *)CONV = dVar8 * (dVar1 + 1.0) - dVar1 * dVar7;
        POLYEV(local_64,(double *)CONV,SR,SI,PR,PI,QPR,QPI,PVR);
        iVar5 = 5;
        do {
          NN_00 = local_64;
          CALCT(&local_74,local_64,(double *)CONV,SR,PVI,HR,HI,QHR,local_38,local_40,QPI,PVR,QHI,SHR
               );
          NEXTH(&local_74,NN_00,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        bVar2 = true;
        dVar8 = local_40;
        dVar9 = local_38;
        dStack_70 = local_40;
      }
    }
    iVar5 = local_64;
    CALCT(&local_74,local_64,(double *)CONV,SR,PVI,HR,HI,QHR,dVar9,dVar8,QPI,PVR,QHI,SHR);
    NEXTH(&local_74,iVar5,HI,QHR,PI,QPR,QHI,SHR,PVI,HR);
    CALCT(&local_74,iVar5,(double *)CONV,SR,PVI,HR,HI,QHR,local_38,local_40,QPI,PVR,QHI,SHR);
    if (local_74 == 0) {
      dVar1 = ABS(*QHI);
      dVar8 = ABS(*SHR);
      if (dVar8 <= dVar1) {
        if (dVar1 <= dVar8) {
          dVar7 = dVar1 * 1.4142135623730951;
        }
        else {
          dVar7 = (dVar8 / dVar1) * (dVar8 / dVar1) + 1.0;
          if (dVar7 < 0.0) {
            uStack_50 = 0;
            local_58 = dVar1;
            dVar7 = sqrt(dVar7);
            dVar1 = local_58;
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          dVar7 = dVar7 * dVar1;
        }
      }
      else {
        dVar7 = (dVar1 / dVar8) * (dVar1 / dVar8) + 1.0;
        if (dVar7 < 0.0) {
          uStack_50 = 0;
          local_58 = dVar8;
          dVar7 = sqrt(dVar7);
          dVar8 = local_58;
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar7 = dVar7 * dVar8;
      }
      dVar1 = ABS(*(double *)CONV);
      dVar8 = ABS(*SR);
      if (dVar8 <= dVar1) {
        if (dVar1 <= dVar8) {
          dVar9 = dVar1 * 1.4142135623730951;
        }
        else {
          dVar9 = (dVar8 / dVar1) * (dVar8 / dVar1) + 1.0;
          if (dVar9 < 0.0) {
            uStack_50 = 0;
            local_58 = dVar1;
            dVar9 = sqrt(dVar9);
            dVar1 = local_58;
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          dVar9 = dVar9 * dVar1;
        }
      }
      else {
        dVar9 = (dVar1 / dVar8) * (dVar1 / dVar8) + 1.0;
        if (dVar9 < 0.0) {
          uStack_50 = 0;
          local_58 = dVar8;
          dVar9 = sqrt(dVar9);
          dVar8 = local_58;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar9 = dVar9 * dVar8;
      }
      local_88 = dVar7 / dVar9;
      *(double *)CONV = *(double *)CONV + *QHI;
      *SR = *SR + *SHR;
    }
    iVar3 = iVar3 + 1;
    local_b0 = dStack_70;
  } while (iVar3 != 10);
  return;
}

Assistant:

static void VRSHFT(int NN, int L3, double *ZR, double *ZI, int *CONV,double *SR, double *SI,double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/*
	C CARRIES OUT THE THIRD STAGE ITERATION.
	C L3 - LIMIT OF STEPS IN STAGE 3.
	C ZR,ZI   - ON ENTRY CONTAINS THE INITIAL ITERATE, IF THE
	C ITERATION CONVERGES IT CONTAINS THE FINAL ITERATE
	C ON EXIT.
	C CONV    -  .TRUE. IF ITERATION CONVERGES
	*/
	double MP, MS, OMP, RELSTP, R1, R2, TP;
	int B,BOOL,i,j;
	*SR = *ZR;
	*SI = *ZI;
	B = 0;
	*CONV = 0;


	for (i = 0; i < L3; ++i) {
		POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
		MP = CMOD(PVR,PVI);
		MS = CMOD(SR, SI);
		if (MP <= 20.0*ERREV(NN, QPR, QPI, MS, MP, ARE, MRE)) {
			*CONV = 1;
			*ZR = *SR;
			*ZI = *SI;
			break;
		}
		else {//10
			if (i == 0) {
				OMP = MP;
			}
			else {
				if (!(B == 1 || MP < OMP || RELSTP >= .05)) {
					TP = RELSTP;
					B = 1;
					if (RELSTP < ETA) {
						TP = ETA;
					}
					R1 = sqrt(TP);
					R2 = *SR * (1.0 + R1) - *SI*R1;
					*SI = *SR*R1 + *SI*(1.0 + R1);
					*SR = R2;
					POLYEV(NN, SR, SI, PR, PI, QPR, QPI, PVR, PVI);
					for (j = 0; j < 5;++j) {
						CALCT(&BOOL,NN,SR,SI,HR,HI,QHR, QHI,ARE,INFIN,PVR, PVI,TR,TI);
						NEXTH(&BOOL,NN,QHR,QHI,QPR,QPI,TR, TI, HR,HI);
					}
					OMP = INFIN;
				}
				else {
					if (MP*0.1 > OMP) {
						break;
					}
					OMP = MP;
				}

			}

			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);
			NEXTH(&BOOL, NN, QHR, QHI, QPR, QPI, TR, TI, HR, HI);
			CALCT(&BOOL, NN, SR, SI, HR, HI, QHR, QHI, ARE, INFIN, PVR, PVI, TR, TI);

			if (BOOL == 0) {
				RELSTP = CMOD(TR, TI) / CMOD(SR, SI);
				*SR = *SR + *TR;
				*SI = *SI + *TI;
			}

		}
	}//60
}